

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionNextChar.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionNextChar::write_cpp
          (InstructionNextChar *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  StreamSep *pSVar4;
  ostream *poVar5;
  long *plVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  uint cont_label;
  uint local_42c;
  string local_428;
  undefined1 local_408 [16];
  undefined1 local_3f8 [24];
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [3];
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  string local_2f8;
  string local_2d8;
  StreamSep local_2b8;
  StreamSep local_270;
  StreamSep local_228;
  StreamSep local_1e0;
  StreamSep local_198;
  StreamSep local_150;
  StreamSep local_108;
  StreamSep local_c0;
  StreamSep local_78;
  
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if (bVar1) {
    local_42c = cpp_emitter->nb_cont_label + 1;
    cpp_emitter->nb_cont_label = local_42c;
    StreamSepMaker::operator<<((StreamSep *)local_408,ss,(char (*) [11])"if ( data ");
    local_380._0_8_ = ">=";
    if ((this->super_Instruction).field_0x174 != '\0') {
      local_380._0_8_ = ">";
    }
    pSVar4 = StreamSep::operator<<((StreamSep *)local_408,(char **)local_380);
    pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x17f45e);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,(pSVar4->sep)._M_string_length
                       );
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x17d5c3);
    StreamSep::~StreamSep((StreamSep *)local_408);
    if ((this->super_Instruction).field_0x174 == '\0') {
      StreamSepMaker::operator<<(&local_78,ss,(char (*) [8])"++data;");
      StreamSep::~StreamSep(&local_78);
    }
    StreamSepMaker::rm_beg((StreamSepMaker *)local_408,es,2);
    StreamSepMaker::operator<<
              ((StreamSep *)local_380,(StreamSepMaker *)local_408,(char (*) [3])0x17e17b);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_380._0_8_,(char *)local_380._8_8_,
                        local_370[0]._M_allocated_capacity);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pSVar4 = StreamSep::operator<<((StreamSep *)local_380,(char (*) [2])0x17d6d7);
    bVar1 = cpp_emitter->trace_labels;
    if (bVar1 == true) {
      to_string<unsigned_int>(&local_2d8,&local_42c);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x17f22c);
      local_318 = &local_308;
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_308 = *plVar7;
        lStack_300 = plVar6[3];
      }
      else {
        local_308 = *plVar7;
        local_318 = (long *)*plVar6;
      }
      local_310 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_428.field_2._M_allocated_capacity = *puVar8;
        local_428.field_2._8_8_ = plVar6[3];
      }
      else {
        local_428.field_2._M_allocated_capacity = *puVar8;
        local_428._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_428._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
    }
    else {
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,(pSVar4->sep)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_428._M_dataplus._M_p,local_428._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 != false) {
      if (local_318 != &local_308) {
        operator_delete(local_318,local_308 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
    }
    StreamSep::~StreamSep((StreamSep *)local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_p != &local_390) {
      operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_p != &local_3d0) {
      operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_408._8_8_ != local_3f8 + 8) {
      operator_delete((void *)local_408._8_8_,local_3f8._8_8_ + 1);
    }
    if (((this->super_Instruction).field_0x174 == '\x01') &&
       (1 < (ulong)(((long)(this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)))
    {
      StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [21])"if ( ! buf ) goto l_");
      iVar2 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
      std::ostream::operator<<((ostream *)poVar5,iVar2);
      StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
      StreamSep::~StreamSep((StreamSep *)local_408);
    }
    if (cpp_emitter->buffer_type == 0) {
      StreamSepMaker::operator<<
                ((StreamSep *)local_408,es,
                 (char (*) [173])
                 "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_"
                );
      iVar2 = Instruction::get_id_gen
                        (((this->super_Instruction).next.
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
      std::ostream::operator<<((ostream *)poVar5,iVar2);
      StreamSep::operator<<((StreamSep *)local_408,(char (*) [6])"; } }");
    }
    else {
      uVar3 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar3 == 0) {
        StreamSepMaker::operator<<
                  ((StreamSep *)local_408,es,
                   (char (*) [175])
                   "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                  );
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [6])"; } }");
      }
      else {
        StreamSepMaker::operator<<
                  ((StreamSep *)local_408,es,
                   (char (*) [53])"while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, ");
        Instruction::need_buf_next(&this->super_Instruction);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pSVar4 = StreamSep::operator<<
                           ((StreamSep *)local_408,
                            (char (*) [102])
                            " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_"
                           );
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,
                            (pSVar4->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<(pSVar4,(char (*) [6])"; } }");
      }
    }
    StreamSep::~StreamSep((StreamSep *)local_408);
    bVar1 = CppEmitter::interruptible(cpp_emitter);
    uVar9 = ((long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (bVar1) {
      if (1 < uVar9) {
        StreamSepMaker::operator<<
                  ((StreamSep *)local_408,es,(char (*) [24])"if ( last_buf ) goto l_");
        iVar2 = Instruction::get_id_gen
                          ((this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
      }
      uVar3 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar3 == 0) {
        StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [27])0x17e00b);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
        StreamSepMaker::operator<<(&local_228,es,(char (*) [17])0x17e051);
        StreamSep::~StreamSep(&local_228);
        StreamSepMaker::rm_beg((StreamSepMaker *)local_408,es,2);
        StreamSepMaker::operator<<
                  ((StreamSep *)local_380,(StreamSepMaker *)local_408,(char (*) [3])0x17e068);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_380._0_8_,(char *)local_380._8_8_,
                            local_370[0]._M_allocated_capacity);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        StreamSep::operator<<((StreamSep *)local_380,(char (*) [2])0x17d6d7);
        StreamSep::~StreamSep((StreamSep *)local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_p != &local_390) {
          operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p != &local_3b0) {
          operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_p != &local_3d0) {
          operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_408._8_8_ != local_3f8 + 8) {
          operator_delete((void *)local_408._8_8_,local_3f8._8_8_ + 1);
        }
        StreamSepMaker::operator<<
                  ((StreamSep *)local_408,es,(char (*) [29])"if ( data > end_m1 ) goto c_");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
        StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [8])0x17df7c);
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
      }
      else {
        local_408._0_8_ = local_3f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"pending_buf","");
        local_380._0_8_ = (ostream *)(local_380 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"HPIPE_BUFF_T *","");
        local_428._M_string_length = 0;
        local_428.field_2._M_allocated_capacity =
             local_428.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        CppEmitter::add_variable(cpp_emitter,(string *)local_408,(string *)local_380,&local_428);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if ((ostream *)local_380._0_8_ != (ostream *)(local_380 + 0x10)) {
          operator_delete((void *)local_380._0_8_,local_370[0]._M_allocated_capacity + 1);
        }
        if ((ostream *)local_408._0_8_ != (ostream *)local_3f8) {
          operator_delete((void *)local_408._0_8_,local_3f8._0_8_ + 1);
        }
        StreamSepMaker::operator<<(&local_c0,es,(char (*) [30])0x17df98);
        StreamSep::~StreamSep(&local_c0);
        StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [27])0x17e00b);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
        uVar3 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar3 == 1) {
          pSVar4 = &local_108;
          StreamSepMaker::operator<<(pSVar4,es,(char (*) [30])0x17dfbe);
        }
        else {
          StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [31])0x17dfe4);
          Instruction::need_buf_next(&this->super_Instruction);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          StreamSep::operator<<((StreamSep *)local_408,(char (*) [4])0x17d5c1);
          pSVar4 = (StreamSep *)local_408;
        }
        StreamSep::~StreamSep(pSVar4);
        StreamSepMaker::operator<<(&local_150,es,(char (*) [17])0x17e051);
        StreamSep::~StreamSep(&local_150);
        StreamSepMaker::rm_beg((StreamSepMaker *)local_408,es,2);
        StreamSepMaker::operator<<
                  ((StreamSep *)local_380,(StreamSepMaker *)local_408,(char (*) [3])0x17e068);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_380._0_8_,(char *)local_380._8_8_,
                            local_370[0]._M_allocated_capacity);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        pSVar4 = StreamSep::operator<<((StreamSep *)local_380,(char (*) [2])0x17d6d7);
        bVar1 = cpp_emitter->trace_labels;
        if (bVar1 == true) {
          to_string<unsigned_int>(&local_2f8,&local_42c);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x17e06b);
          local_338 = &local_328;
          plVar7 = plVar6 + 2;
          if ((long *)*plVar6 == plVar7) {
            local_328 = *plVar7;
            lStack_320 = plVar6[3];
          }
          else {
            local_328 = *plVar7;
            local_338 = (long *)*plVar6;
          }
          local_330 = plVar6[1];
          *plVar6 = (long)plVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          puVar8 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_428.field_2._M_allocated_capacity = *puVar8;
            local_428.field_2._8_8_ = plVar6[3];
          }
          else {
            local_428.field_2._M_allocated_capacity = *puVar8;
            local_428._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_428._M_string_length = plVar6[1];
          *plVar6 = (long)puVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
        }
        else {
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,
                            (pSVar4->sep)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_428._M_dataplus._M_p,local_428._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if (bVar1 != false) {
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
        }
        StreamSep::~StreamSep((StreamSep *)local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_p != &local_390) {
          operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_p != &local_3b0) {
          operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_p != &local_3d0) {
          operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_408._8_8_ != local_3f8 + 8) {
          operator_delete((void *)local_408._8_8_,local_3f8._8_8_ + 1);
        }
        StreamSepMaker::operator<<(&local_198,es,(char (*) [36])0x17e0a2);
        StreamSep::~StreamSep(&local_198);
        StreamSepMaker::operator<<(&local_1e0,es,(char (*) [30])0x17df98);
        StreamSep::~StreamSep(&local_1e0);
        StreamSepMaker::operator<<
                  ((StreamSep *)local_408,es,(char (*) [29])"if ( data > end_m1 ) goto c_");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
        StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [8])0x17df7c);
        iVar2 = Instruction::get_id_gen
                          (((this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start)->inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
      }
    }
    else {
      if (uVar9 < 2) goto LAB_001708d4;
      StreamSepMaker::operator<<((StreamSep *)local_408,es,(char (*) [8])0x17df7c);
      iVar2 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_408._0_8_,(char *)local_408._8_8_,local_3f8._0_8_);
      std::ostream::operator<<((ostream *)poVar5,iVar2);
      StreamSep::operator<<((StreamSep *)local_408,(char (*) [2])0x17d5c3);
    }
    pSVar4 = (StreamSep *)local_408;
  }
  else {
    uVar9 = ((long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (cpp_emitter->buffer_type == 3) {
      if (1 < uVar9) {
        StreamSepMaker::operator<<((StreamSep *)local_408,ss,(char (*) [7])"if ( *");
        local_380._0_8_ = "( data + 1 )";
        if ((this->super_Instruction).field_0x174 != '\0') {
          local_380._0_8_ = "data";
        }
        pSVar4 = StreamSep::operator<<((StreamSep *)local_408,(char **)local_380);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [5])0x17ea7c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,
                            (pSVar4->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar5,cpp_emitter->stop_char);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [11])0x17ea4b);
        iVar2 = Instruction::get_id_gen
                          ((this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,
                            (pSVar4->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
      }
      if ((this->super_Instruction).field_0x174 != '\0') goto LAB_001708d4;
      pSVar4 = &local_270;
    }
    else {
      if (1 < uVar9) {
        StreamSepMaker::operator<<((StreamSep *)local_408,ss,(char (*) [11])"if ( data ");
        local_380._0_8_ = ">=";
        if ((this->super_Instruction).field_0x174 != '\0') {
          local_380._0_8_ = ">";
        }
        pSVar4 = StreamSep::operator<<((StreamSep *)local_408,(char **)local_380);
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [18])0x17e2e1);
        iVar2 = Instruction::get_id_gen
                          ((this->super_Instruction).next.
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (pSVar4->stream,(pSVar4->sep)._M_dataplus._M_p,
                            (pSVar4->sep)._M_string_length);
        std::ostream::operator<<((ostream *)poVar5,iVar2);
        StreamSep::operator<<(pSVar4,(char (*) [2])0x17d5c3);
        StreamSep::~StreamSep((StreamSep *)local_408);
      }
      if ((this->super_Instruction).field_0x174 != '\0') goto LAB_001708d4;
      pSVar4 = &local_2b8;
    }
    StreamSepMaker::operator<<(pSVar4,ss,(char (*) [8])"++data;");
  }
  StreamSep::~StreamSep(pSVar4);
LAB_001708d4:
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionNextChar::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;
        ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto c_" << cont_label << ";"; // this one is good but it won't the case for the next
        if ( ! beg )
            ss << "++data;";

        // c_... (code when there is no data left in the buffer)
        es.rm_beg( 2 ) << "c_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"c_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        // es << "while ( buf->next ) {" << ( need_buf_next() > 1 ? " HPIPE_BUFF_T__INC_REF_N( buf, " + to_string( need_buf_next() - 1 ) + " );" : "" ) << " buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            es << "while ( buf->next ) { end -= buf->used; buf = buf->next; if ( buf && buf->used ) { data = buf->data; end_m1 = buf->data + ( buf->used < end ? buf->used : end ) - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else if ( need_buf_next() )
            es << "while ( buf->next ) { HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next; if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";
        else
            es << "while ( buf->next ) { HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old ); if ( buf->used ) { data = buf->data; end_m1 = buf->data + buf->used - 1; goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << "; } }";

        if ( cpp_emitter->interruptible() ) {
            if ( next.size() >= 2 )
                es << "if ( last_buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";

            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                if ( need_buf_next() == 1 )
                    es << "HPIPE_BUFF_T__INC_REF( buf );";
                else
                    es << "HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                es << "HPIPE_DATA.pending_buf->next = buf;";
                es << "HPIPE_DATA.pending_buf = buf;";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            } else {
                es << "HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
                es << "return RET_CONT;";

                // e_... (come back code)
                es.rm_beg( 2 ) << "e_" << cont_label << ":";
                es << "if ( data > end_m1 ) goto c_" << cont_label << ";";
                es << "goto l_" << next[ 0 ].inst->get_id_gen( cpp_emitter ) << ";";
            }
        } else {
            if ( next.size() >= 2 )
                es << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next.size() >= 2 )
            ss << "if ( *" << ( beg ? "data" : "( data + 1 )" ) << " == " << cpp_emitter->stop_char << " ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    } else { // not interruptible
        if ( next.size() >= 2 )
            ss << "if ( data " << ( beg ? ">" : ">=" ) << " end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( ! beg )
            ss << "++data;";
    }

    write_trans( ss, cpp_emitter );
}